

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionSpecConstantWorkDim
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint id;
  spv_result_t sVar2;
  DiagnosticStream DStack_1f8;
  
  id = Instruction::GetOperandAs<unsigned_int>(inst,4);
  bVar1 = IsUint32Constant(_,id);
  sVar2 = SPV_SUCCESS;
  if (!bVar1) {
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&DStack_1f8,"Dim must be a 32-bit unsigned integer OpConstant",0x30);
    DiagnosticStream::~DiagnosticStream(&DStack_1f8);
    sVar2 = DStack_1f8.error_;
  }
  return sVar2;
}

Assistant:

spv_result_t ValidateClspvReflectionSpecConstantWorkDim(
    ValidationState_t& _, const Instruction* inst) {
  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(4))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Dim must be a 32-bit unsigned integer OpConstant";
  }

  return SPV_SUCCESS;
}